

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

TIntermTyped * __thiscall
glslang::HlslParseContext::constructAggregate
          (HlslParseContext *this,TIntermNode *node,TType *type,int paramCount,TSourceLoc *loc)

{
  TIntermediate *this_00;
  TString name;
  TString name_00;
  TString structName;
  TString structName_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  TIntermTyped *pTVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TType *this_01;
  pool_allocator<char> pVar4;
  pool_allocator<char> pVar5;
  pool_allocator<char> pVar6;
  undefined1 in_stack_fffffffffffffe98 [12];
  undefined8 in_stack_fffffffffffffea8;
  pool_allocator<char> in_stack_fffffffffffffec0;
  pool_allocator<char> in_stack_fffffffffffffec8;
  pool_allocator<char> local_128;
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_120 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_f8 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_d0 [40];
  TString local_a8;
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_80 [40];
  TString local_58;
  
  this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  iVar2 = (*node->_vptr_TIntermNode[3])(node);
  pTVar3 = TIntermediate::addConversion
                     (this_00,EOpConstructStruct,type,(TIntermTyped *)CONCAT44(extraout_var,iVar2));
  if (pTVar3 != (TIntermTyped *)0x0) {
    iVar2 = (*(pTVar3->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar3);
    bVar1 = TType::operator!=((TType *)CONCAT44(extraout_var_00,iVar2),type);
    if (!bVar1) {
      return pTVar3;
    }
  }
  iVar2 = (*node->_vptr_TIntermNode[3])(node);
  this_01 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0xf0))
                               ((long *)CONCAT44(extraout_var_01,iVar2));
  local_128.allocator = GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>(local_120,"",&local_128);
  pVar4.allocator = GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            (local_80,"",(pool_allocator<char> *)&stack0xfffffffffffffed0);
  name._M_dataplus._M_p = (pointer)local_80;
  name._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)local_120;
  name._16_12_ = in_stack_fffffffffffffe98;
  name.field_2._M_allocated_capacity._4_4_ = paramCount;
  name.field_2._8_8_ = in_stack_fffffffffffffea8;
  structName._M_dataplus._M_p = (pointer)this;
  structName._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)loc;
  structName._M_string_length = (size_type)in_stack_fffffffffffffec0.allocator;
  structName.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffec8.allocator;
  structName.field_2._8_8_ = pVar4.allocator;
  TType::getCompleteString(&local_58,this_01,false,true,true,true,name,structName);
  pVar5.allocator = GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            (local_d0,"",(pool_allocator<char> *)&stack0xfffffffffffffec8);
  pVar6.allocator = GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            (local_f8,"",(pool_allocator<char> *)&stack0xfffffffffffffec0);
  name_00._M_dataplus._M_p = (pointer)local_f8;
  name_00._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)local_d0;
  name_00._16_12_ = in_stack_fffffffffffffe98;
  name_00.field_2._M_allocated_capacity._4_4_ = paramCount;
  name_00.field_2._8_8_ = local_58._M_dataplus._M_p;
  structName_00._M_dataplus._M_p = (pointer)this;
  structName_00._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)loc;
  structName_00._M_string_length = (size_type)pVar6.allocator;
  structName_00.field_2._M_allocated_capacity = (size_type)pVar5.allocator;
  structName_00.field_2._8_8_ = pVar4.allocator;
  TType::getCompleteString(&local_a8,type,false,true,true,true,name_00,structName_00);
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
            (this,loc,"","constructor","cannot convert parameter %d from \'%s\' to \'%s\'",
             (ulong)(uint)paramCount,local_58._M_dataplus._M_p,local_a8._M_dataplus._M_p);
  return (TIntermTyped *)0x0;
}

Assistant:

TIntermTyped* HlslParseContext::constructAggregate(TIntermNode* node, const TType& type, int paramCount,
                                                   const TSourceLoc& loc)
{
    // Handle cases that map more 1:1 between constructor arguments and constructed.
    TIntermTyped* converted = intermediate.addConversion(EOpConstructStruct, type, node->getAsTyped());
    if (converted == nullptr || converted->getType() != type) {
        error(loc, "", "constructor", "cannot convert parameter %d from '%s' to '%s'", paramCount,
            node->getAsTyped()->getType().getCompleteString().c_str(), type.getCompleteString().c_str());

        return nullptr;
    }

    return converted;
}